

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O2

QDBusMenuShortcut *
QDBusMenuItem::convertKeySequence(QDBusMenuShortcut *__return_storage_ptr__,QKeySequence *sequence)

{
  bool bVar1;
  int iVar2;
  QKeyCombination QVar3;
  int i;
  uint index;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QList<QString> *)0x0;
  (__return_storage_ptr__->d).size = 0;
  index = 0;
  do {
    iVar2 = QKeySequence::count(sequence);
    if (iVar2 <= (int)index) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    local_58.d = (Data *)0x0;
    local_58.ptr = (QString *)0x0;
    local_58.size = 0;
    QVar3 = QKeySequence::operator[](sequence,index);
    if (((uint)QVar3.combination >> 0x1c & 1) != 0) {
      local_90.d = (Data *)0x0;
      local_90.ptr = (char16_t *)0x0;
      local_78.d = (Data *)0x0;
      local_78.ptr = L"Super";
      local_90.size = 0;
      local_78.size = 5;
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    if (((uint)QVar3.combination >> 0x1a & 1) != 0) {
      local_90.d = (Data *)0x0;
      local_90.ptr = (char16_t *)0x0;
      local_78.d = (Data *)0x0;
      local_78.ptr = L"Control";
      local_90.size = 0;
      local_78.size = 7;
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    if (((uint)QVar3.combination >> 0x1b & 1) != 0) {
      local_90.d = (Data *)0x0;
      local_90.ptr = (char16_t *)0x0;
      local_78.d = (Data *)0x0;
      local_78.ptr = L"Alt";
      local_90.size = 0;
      local_78.size = 3;
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    if (((uint)QVar3.combination >> 0x19 & 1) != 0) {
      local_90.d = (Data *)0x0;
      local_90.ptr = (char16_t *)0x0;
      local_78.d = (Data *)0x0;
      local_78.ptr = L"Shift";
      local_90.size = 0;
      local_78.size = 5;
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    if (((uint)QVar3.combination >> 0x1d & 1) != 0) {
      local_90.d = (Data *)0x0;
      local_90.ptr = (char16_t *)0x0;
      local_78.d = (Data *)0x0;
      local_78.ptr = L"Num";
      local_90.size = 0;
      local_78.size = 3;
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QVar3 = QKeySequence::operator[](sequence,index);
    QKeySequencePrivate::keyName((QString *)&local_78,QVar3.combination & Key_unknown,PortableText);
    local_90.d = (Data *)0x1;
    local_90.ptr = L"+";
    bVar1 = ::operator==((QString *)&local_78,(QLatin1StringView *)&local_90);
    if (bVar1) {
      local_90.ptr = L"plus";
      local_90.size = 4;
LAB_0058ecc7:
      local_90.d = (Data *)0x0;
      local_a8.size = 0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.d = (Data *)0x0;
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    }
    else {
      local_90.d = (Data *)0x1;
      local_90.ptr = L"-";
      bVar1 = ::operator==((QString *)&local_78,(QLatin1StringView *)&local_90);
      if (bVar1) {
        local_90.ptr = L"minus";
        local_90.size = 5;
        goto LAB_0058ecc7;
      }
      QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_58,(QString *)&local_78);
    }
    QList<QList<QString>>::emplaceBack<QList<QString>const&>
              ((QList<QList<QString>> *)__return_storage_ptr__,(QList<QString> *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    index = index + 1;
  } while( true );
}

Assistant:

QDBusMenuShortcut QDBusMenuItem::convertKeySequence(const QKeySequence &sequence)
{
    QDBusMenuShortcut shortcut;
    for (int i = 0; i < sequence.count(); ++i) {
        QStringList tokens;
        auto modifiers = sequence[i].keyboardModifiers();
        if (modifiers & Qt::MetaModifier)
            tokens << QStringLiteral("Super");
        if (modifiers & Qt::ControlModifier)
            tokens << QStringLiteral("Control");
        if (modifiers & Qt::AltModifier)
            tokens << QStringLiteral("Alt");
        if (modifiers & Qt::ShiftModifier)
            tokens << QStringLiteral("Shift");
        if (modifiers & Qt::KeypadModifier)
            tokens << QStringLiteral("Num");

        QString keyName = QKeySequencePrivate::keyName(sequence[i].key(), QKeySequence::PortableText);
        if (keyName == "+"_L1)
            tokens << QStringLiteral("plus");
        else if (keyName == "-"_L1)
            tokens << QStringLiteral("minus");
        else
            tokens << keyName;
        shortcut << tokens;
    }
    return shortcut;
}